

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lj_cconv.c
# Opt level: O3

int lj_cconv_tv_ct(CTState *cts,CType *s,CTypeID sid,TValue *o,uint8_t *sp)

{
  int iVar1;
  CTypeID CVar2;
  void *pvVar3;
  uint uVar4;
  bool bVar5;
  
  uVar4 = s->info;
  if (uVar4 < 0x10000000) {
    if (0x7ffffff < uVar4) {
      if (s->size == 1) {
        bVar5 = *sp == '\0';
      }
      else {
        bVar5 = *(int *)sp == 0;
      }
      (o->field_2).it = -(uint)!bVar5 - 2;
      (cts->g->tmptv2).field_2.it = -(uint)!bVar5 - 2;
      return 0;
    }
    if ((0x3ffffff < uVar4) || (uVar4 = s->size, uVar4 < 5)) {
      lj_cconv_ct_ct(cts,cts->tab + 0xe,s,(uint8_t *)&o->u64,sp,0);
      return 0;
    }
  }
  else {
    if ((uVar4 & 0xf0000000) == 0x10000000 || (uVar4 & 0xfc000000) == 0x30000000) {
      CVar2 = lj_ctype_intern(cts,sid + 0x22830000,8);
      pvVar3 = lj_mem_newgco(cts->L,0x10);
      *(undefined1 *)((long)pvVar3 + 5) = 10;
      *(short *)((long)pvVar3 + 6) = (short)CVar2;
      *(uint8_t **)((long)pvVar3 + 8) = sp;
      (o->u32).lo = (uint32_t)pvVar3;
      (o->field_2).it = 0xfffffff5;
      return 1;
    }
    uVar4 = s->size;
  }
  iVar1 = *(int *)&cts->tab;
  pvVar3 = lj_mem_newgco(cts->L,uVar4 + 8);
  *(undefined1 *)((long)pvVar3 + 5) = 10;
  *(short *)((long)pvVar3 + 6) = (short)((uint)((int)s - iVar1) >> 4);
  (o->u32).lo = (uint32_t)pvVar3;
  (o->field_2).it = 0xfffffff5;
  memcpy((void *)((long)pvVar3 + 8),sp,(ulong)uVar4);
  return 1;
}

Assistant:

int lj_cconv_tv_ct(CTState *cts, CType *s, CTypeID sid,
		   TValue *o, uint8_t *sp)
{
  CTInfo sinfo = s->info;
  if (ctype_isnum(sinfo)) {
    if (!ctype_isbool(sinfo)) {
      if (ctype_isinteger(sinfo) && s->size > 4) goto copyval;
      if (LJ_DUALNUM && ctype_isinteger(sinfo)) {
	int32_t i;
	lj_cconv_ct_ct(cts, ctype_get(cts, CTID_INT32), s,
		       (uint8_t *)&i, sp, 0);
	if ((sinfo & CTF_UNSIGNED) && i < 0)
	  setnumV(o, (lua_Number)(uint32_t)i);
	else
	  setintV(o, i);
      } else {
	lj_cconv_ct_ct(cts, ctype_get(cts, CTID_DOUBLE), s,
		       (uint8_t *)&o->n, sp, 0);
	/* Numbers are NOT canonicalized here! Beware of uninitialized data. */
	lua_assert(tvisnum(o));
      }
    } else {
      uint32_t b = s->size == 1 ? (*sp != 0) : (*(int *)sp != 0);
      setboolV(o, b);
      setboolV(&cts->g->tmptv2, b);  /* Remember for trace recorder. */
    }
    return 0;
  } else if (ctype_isrefarray(sinfo) || ctype_isstruct(sinfo)) {
    /* Create reference. */
    setcdataV(cts->L, o, lj_cdata_newref(cts, sp, sid));
    return 1;  /* Need GC step. */
  } else {
    GCcdata *cd;
    CTSize sz;
  copyval:  /* Copy value. */
    sz = s->size;
    lua_assert(sz != CTSIZE_INVALID);
    /* Attributes are stripped, qualifiers are kept (but mostly ignored). */
    cd = lj_cdata_new(cts, ctype_typeid(cts, s), sz);
    setcdataV(cts->L, o, cd);
    memcpy(cdataptr(cd), sp, sz);
    return 1;  /* Need GC step. */
  }
}